

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytedata_p.h
# Opt level: O2

ssize_t __thiscall QByteDataBuffer::read(QByteDataBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  iterator iVar1;
  undefined4 in_register_00000034;
  QByteDataBuffer *this_00;
  
  this_00 = (QByteDataBuffer *)CONCAT44(in_register_00000034,__fd);
  squeezeFirst(this_00);
  iVar1 = QList<QByteArray>::begin((QList<QByteArray> *)this_00);
  this_00->bufferCompleteSize = this_00->bufferCompleteSize - ((iVar1.i)->d).size;
  QList<QByteArray>::takeFirst((value_type *)this,(QList<QByteArray> *)this_00);
  return (ssize_t)this;
}

Assistant:

inline QByteArray read()
    {
        Q_ASSERT(!isEmpty());
        squeezeFirst();
        bufferCompleteSize -= buffers.first().size();
        return buffers.takeFirst();
    }